

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O1

size_t callback(char *ptr,size_t size,size_t nmemb,void *data)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 uVar4;
  size_t sVar5;
  long sznum;
  long longdata;
  int local_30 [2];
  
  uVar2 = *data;
  sVar5 = nmemb * size;
  piVar1 = (int *)((long)counter + ((long)data + -0x106110 >> 1));
  *piVar1 = *piVar1 + (int)sVar5;
  iVar3 = curl_easy_getinfo(uVar2,0x20001d,local_30);
  uVar2 = _stderr;
  if (iVar3 == 0) {
    if (local_30[0] == -1) {
      return sVar5;
    }
    sznum = (long)data + -0x106110 >> 3;
    if (sockets[sznum] == -1) {
      sockets[sznum] = local_30[0];
      return sVar5;
    }
    if (sockets[sznum] == local_30[0]) {
      return sVar5;
    }
    iVar3 = curlx_sztosi(sznum);
    curl_mfprintf(uVar2,"Handle %d started on socket %d and moved to %d\n",iVar3,sockets[sznum],
                  local_30[0]);
  }
  else {
    uVar4 = curl_easy_strerror(iVar3);
    curl_mfprintf(uVar2,"%s:%d curl_easy_getinfo() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/libntlmconnect.c"
                  ,0x37,iVar3,uVar4);
  }
  res = 0x7e;
  return (ulong)(nmemb == 0 || size == 0);
}

Assistant:

static size_t callback(char *ptr, size_t size, size_t nmemb, void *data)
{
  ssize_t idx = ((CURL **) data) - easy;
  curl_socket_t sock;
  long longdata;
  CURLcode code;
  const size_t failure = (size && nmemb) ? 0 : 1;
  (void)ptr;

  counter[idx] += (int)(size * nmemb);

  /* Get socket being used for this easy handle, otherwise CURL_SOCKET_BAD */
  code = curl_easy_getinfo(easy[idx], CURLINFO_LASTSOCKET, &longdata);
  if(CURLE_OK != code) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed, "
            "with code %d (%s)\n",
            __FILE__, __LINE__, (int)code, curl_easy_strerror(code));
    res = TEST_ERR_MAJOR_BAD;
    return failure;
  }
  if(longdata == -1L)
    sock = CURL_SOCKET_BAD;
  else
    sock = (curl_socket_t)longdata;

  if(sock != CURL_SOCKET_BAD) {
    /* Track relationship between this easy handle and the socket. */
    if(sockets[idx] == CURL_SOCKET_BAD) {
      /* An easy handle without previous socket, record the socket. */
      sockets[idx] = sock;
    }
    else if(sock != sockets[idx]) {
      /* An easy handle with a socket different to previously
         tracked one, log and fail right away. Known bug #37. */
      fprintf(stderr, "Handle %d started on socket %d and moved to %d\n",
              curlx_sztosi(idx), (int)sockets[idx], (int)sock);
      res = TEST_ERR_MAJOR_BAD;
      return failure;
    }
  }
  return size * nmemb;
}